

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  long lVar2;
  sqlite3_io_methods *pFirst;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  sqlite3_io_methods *psVar8;
  sqlite3_io_methods *psVar9;
  int iVar10;
  int iVar11;
  sqlite3_file sVar12;
  sqlite3_io_methods *psVar13;
  sqlite3_io_methods *psVar14;
  long lVar15;
  int iVar16;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar11 = *(int *)((long)&pJfd[1].pMethods + 4);
  if (((long)iVar11 < 1) || (iAmt + iOfst <= (long)iVar11)) {
    if (iOfst < 1) {
      if ((iOfst != 0) || (pJfd[2].pMethods == (sqlite3_io_methods *)0x0)) goto LAB_00133b1c;
      memcpy(&(pJfd[2].pMethods)->xClose,zBuf,(long)iAmt);
    }
    else {
      if (pJfd[3].pMethods != (sqlite3_io_methods *)iOfst) {
        memjrnlTruncate(pJfd,iOfst);
      }
LAB_00133b1c:
      for (; 0 < iAmt; iAmt = iAmt - iVar10) {
        psVar14 = pJfd[4].pMethods;
        iVar11 = *(int *)&pJfd[1].pMethods;
        lVar15 = (long)pJfd[3].pMethods % (long)iVar11;
        iVar10 = iVar11 - (int)lVar15;
        if (iAmt < iVar10) {
          iVar10 = iAmt;
        }
        sVar12.pMethods = psVar14;
        if (lVar15 == 0) {
          sVar12.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar11 + 8);
          if (sVar12.pMethods == (sqlite3_io_methods *)0x0) {
            iVar10 = 0xc0a;
            goto LAB_00133ce2;
          }
          *(undefined8 *)sVar12.pMethods = 0;
          if (psVar14 == (sqlite3_io_methods *)0x0) {
            psVar14 = (sqlite3_io_methods *)(pJfd + 2);
          }
          *(sqlite3_io_methods **)psVar14 = sVar12.pMethods;
          pJfd[4].pMethods = sVar12.pMethods;
        }
        __n = (size_t)iVar10;
        memcpy((void *)((long)&(sVar12.pMethods)->xClose + lVar15),zBuf,__n);
        zBuf = (void *)((long)zBuf + __n);
        pJfd[3].pMethods = (sqlite3_io_methods *)((long)&(pJfd[3].pMethods)->iVersion + __n);
      }
    }
    iVar10 = 0;
  }
  else {
    psVar14 = pJfd->pMethods;
    iVar1 = *(int *)&pJfd[1].pMethods;
    pFirst = pJfd[2].pMethods;
    psVar3 = pJfd[3].pMethods;
    psVar4 = pJfd[6].pMethods;
    psVar8 = pJfd[4].pMethods;
    psVar9 = pJfd[5].pMethods;
    psVar5 = pJfd[7].pMethods;
    psVar6 = pJfd[8].pMethods;
    psVar7 = pJfd[9].pMethods;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    iVar10 = (*psVar6->xSync)((sqlite3_file *)psVar6,(int)psVar7);
    if (iVar10 == 0) {
      lVar15 = 0;
      iVar16 = iVar1;
      for (psVar13 = pFirst; psVar13 != (sqlite3_io_methods *)0x0;
          psVar13 = *(sqlite3_io_methods **)psVar13) {
        if ((long)psVar3 < iVar16 + lVar15) {
          iVar16 = (int)psVar3 - (int)lVar15;
        }
        iVar10 = (*pJfd->pMethods->xWrite)(pJfd,&psVar13->xClose,iVar16,lVar15);
        if (iVar10 != 0) goto LAB_00133c6d;
        lVar15 = lVar15 + iVar16;
      }
      memjrnlFreeChunks((FileChunk *)pFirst);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        iVar11 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
        return iVar11;
      }
      goto LAB_00133d09;
    }
LAB_00133c6d:
    if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
      (*pJfd->pMethods->xClose)(pJfd);
    }
    pJfd->pMethods = psVar14;
    *(int *)&pJfd[1].pMethods = iVar1;
    *(int *)((long)&pJfd[1].pMethods + 4) = iVar11;
    pJfd[2].pMethods = pFirst;
    pJfd[3].pMethods = psVar3;
    pJfd[6].pMethods = psVar4;
    pJfd[4].pMethods = psVar8;
    pJfd[5].pMethods = psVar9;
    pJfd[7].pMethods = psVar5;
    pJfd[8].pMethods = psVar6;
    pJfd[9].pMethods = psVar7;
  }
LAB_00133ce2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar10;
  }
LAB_00133d09:
  __stack_chk_fail();
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}